

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O1

QLoggingRegistry * QLoggingRegistry::instance(void)

{
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  
  lVar2 = __tls_get_addr(&PTR_006ba338);
  if (*(char *)(lVar2 + 0x29) == '\0') {
    *(undefined1 *)(lVar2 + 0x29) = 1;
    if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>::guard._q_value
              .super___atomic_base<signed_char>._M_i < -1) {
      puVar3 = (undefined1 *)0x0;
    }
    else {
      puVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
               ::instance()::holder;
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>::
          instance()::holder == '\0') {
        iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
                                     ::instance()::holder);
        if (iVar1 != 0) {
          puVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
                   ::instance()::holder;
          QLoggingRegistry((QLoggingRegistry *)
                           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
                           ::instance()::holder);
          QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>::guard._q_value.
          super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
          __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>::
                       ~Holder,QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
                               ::instance()::holder,&__dso_handle);
          __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qtLoggingRegistry>>
                               ::instance()::holder);
        }
      }
    }
    *(undefined1 *)(lVar2 + 0x29) = 0;
  }
  else {
    puVar3 = (undefined1 *)0x0;
  }
  return (QLoggingRegistry *)puVar3;
}

Assistant:

QLoggingRegistry *QLoggingRegistry::instance()
{
    Q_CONSTINIT thread_local bool recursionGuard = false;
    if (recursionGuard)
        return nullptr;
    QScopedValueRollback<bool> rollback(recursionGuard, true);
    return qtLoggingRegistry();
}